

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles31::Functional::PackUnorm4x8Case::iterate(PackUnorm4x8Case *this)

{
  ShaderExecutor *pSVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char *description;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  TestLog *local_228;
  long lStack_220;
  long local_218;
  undefined8 local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  ulong local_1d8;
  ulong local_1d0;
  deRandom local_1c8;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [112];
  ios_base local_140 [272];
  
  dVar3 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c8,dVar3 ^ 0x776002);
  local_218 = 0;
  local_228 = (TestLog *)0x0;
  lStack_220 = 0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 1;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    iVar4 = (uint)(this->m_precision == PRECISION_LOWP) * 2;
  }
  local_1b8 = (undefined1  [8])0x0;
  auStack_1b0._0_8_ = (_func_int **)0x0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_228,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3f800000bf800000;
  auStack_1b0._0_8_ = (_func_int **)0x3f800000bf800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_228,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf0000003f000000;
  auStack_1b0._0_8_ = (_func_int **)0x3f000000bf000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_228,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3fc00000bfc00000;
  auStack_1b0._0_8_ = (_func_int **)0x3fc00000bfc00000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_228,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf4000003e800000;
  auStack_1b0._0_8_ = (_func_int **)0x3f400000be800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_228,
             (Vector<float,_4> *)local_1b8);
  iVar9 = 0xf;
  do {
    fVar16 = deRandom_getFloat(&local_1c8);
    fVar17 = deRandom_getFloat(&local_1c8);
    fVar18 = deRandom_getFloat(&local_1c8);
    fVar19 = deRandom_getFloat(&local_1c8);
    local_1b8._4_4_ = fVar17 * 1.25 + -0.125;
    local_1b8._0_4_ = fVar16 * 1.25 + -0.125;
    auStack_1b0._4_4_ = fVar19 * 1.25 + -0.125;
    auStack_1b0._0_4_ = fVar18 * 1.25 + -0.125;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_228,
               (Vector<float,_4> *)local_1b8);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  iVar9 = 0x50;
  do {
    fVar16 = deRandom_getFloat(&local_1c8);
    fVar17 = deRandom_getFloat(&local_1c8);
    fVar18 = deRandom_getFloat(&local_1c8);
    fVar19 = deRandom_getFloat(&local_1c8);
    local_1b8._4_4_ = fVar17 * 1e+06 + -100000.0;
    local_1b8._0_4_ = fVar16 * 1e+06 + -100000.0;
    auStack_1b0._4_4_ = fVar19 * 1e+06 + -100000.0;
    auStack_1b0._0_4_ = fVar18 * 1e+06 + -100000.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_228,
               (Vector<float,_4> *)local_1b8);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1f8,lStack_220 - (long)local_228 >> 4);
  local_1b8 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1b0,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])local_228;
  local_210 = (deUint64)
              local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar1->_vptr_ShaderExecutor[6])
            (pSVar1,(ulong)(lStack_220 - (long)local_228) >> 4,local_1b8,&local_210);
  local_1d8 = (ulong)(lStack_220 - (long)local_228) >> 4;
  if ((int)local_1d8 < 1) {
    iVar9 = 0;
  }
  else {
    lVar8 = 0;
    lVar10 = 0;
    iVar9 = 0;
    do {
      fVar16 = *(float *)((long)&local_228->m_log + lVar8);
      fVar17 = 1.0;
      if (fVar16 <= 1.0) {
        fVar17 = fVar16;
      }
      fVar16 = (float)(~-(uint)(fVar16 < 0.0) & (uint)(fVar17 * 255.0));
      uVar14 = -(uint)(fVar16 < 0.0);
      uVar14 = (uint)((float)(~uVar14 & 0x3f000000 | uVar14 & 0xbf000000) + fVar16);
      if (0xfe < (int)uVar14) {
        uVar14 = 0xff;
      }
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      fVar16 = *(float *)((long)&local_228->m_log + lVar8 + 4);
      fVar17 = 1.0;
      if (fVar16 <= 1.0) {
        fVar17 = fVar16;
      }
      fVar16 = (float)(~-(uint)(fVar16 < 0.0) & (uint)(fVar17 * 255.0));
      uVar15 = -(uint)(fVar16 < 0.0);
      local_1fc = (int)((float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000) + fVar16);
      if (0xfe < local_1fc) {
        local_1fc = 0xff;
      }
      if (local_1fc < 1) {
        local_1fc = 0;
      }
      fVar16 = *(float *)((long)&local_228[1].m_log + lVar8);
      fVar17 = 1.0;
      if (fVar16 <= 1.0) {
        fVar17 = fVar16;
      }
      fVar16 = (float)(~-(uint)(fVar16 < 0.0) & (uint)(fVar17 * 255.0));
      uVar15 = -(uint)(fVar16 < 0.0);
      iVar13 = (int)((float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000) + fVar16);
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      fVar16 = *(float *)((long)&local_228[1].m_log + lVar8 + 4);
      fVar17 = 1.0;
      if (fVar16 <= 1.0) {
        fVar17 = fVar16;
      }
      fVar16 = (float)(~-(uint)(fVar16 < 0.0) & (uint)(fVar17 * 255.0));
      uVar15 = -(uint)(fVar16 < 0.0);
      iVar12 = (int)((float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000) + fVar16);
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      uVar15 = local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      local_1d0 = (ulong)uVar15;
      iVar11 = uVar14 - (uVar15 & 0xff);
      iVar2 = -iVar11;
      if (0 < iVar11) {
        iVar2 = iVar11;
      }
      iVar5 = local_1fc - (uVar15 >> 8 & 0xff);
      iVar11 = -iVar5;
      if (0 < iVar5) {
        iVar11 = iVar5;
      }
      iVar6 = iVar13 - (uVar15 >> 0x10 & 0xff);
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      iVar7 = iVar12 - (uVar15 >> 0x18);
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      if ((((iVar4 < iVar2) || (iVar4 < iVar11)) || (iVar4 < iVar5)) || (iVar4 < iVar6)) {
        if (iVar9 < 10) {
          local_1b8 = (undefined1  [8])
                      ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          local_200 = iVar9;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_1b0,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(auStack_1b0,(int)lVar10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_1b0,", expected packUnorm4x8(",0x18);
          tcu::operator<<((ostream *)auStack_1b0,
                          (Vector<float,_4> *)((long)&local_228->m_log + lVar8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0,") = ",4);
          local_210 = (deUint64)(local_1fc << 8 | uVar14 | iVar13 << 0x10 | iVar12 << 0x18);
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_210,(ostream *)auStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0,", got ",6);
          local_210 = local_1d0;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_210,(ostream *)auStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_1b0,"\n  diffs = ",0xb);
          local_210._4_4_ = iVar11;
          local_210._0_4_ = iVar2;
          local_208 = iVar5;
          local_204 = iVar6;
          tcu::operator<<((ostream *)auStack_1b0,(Vector<int,_4> *)&local_210);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_1b0,", max diff = ",0xd);
          std::ostream::operator<<((ostringstream *)auStack_1b0,iVar4);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
          std::ios_base::~ios_base(local_140);
          iVar9 = local_200;
        }
        else if (iVar9 == 10) {
          local_1b8 = (undefined1  [8])
                      ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
          std::ios_base::~ios_base(local_140);
        }
        iVar9 = iVar9 + 1;
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar10 < (int)((ulong)(lStack_220 - (long)local_228) >> 4));
  }
  local_1b8 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
  std::ostream::operator<<((ostringstream *)auStack_1b0,(int)local_1d8 - iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0," / ",3);
  std::ostream::operator<<((ostringstream *)auStack_1b0,(int)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
  std::ios_base::~ios_base(local_140);
  description = "Pass";
  if (iVar9 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar9 != 0),description);
  if (local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228 != (TestLog *)0x0) {
    operator_delete(local_228,local_218 - (long)local_228);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^8) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^8) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*1.25f - 0.125f;
			const float y = rnd.getFloat()*1.25f - 0.125f;
			const float z = rnd.getFloat()*1.25f - 0.125f;
			const float w = rnd.getFloat()*1.25f - 0.125f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 1e5f;
			const float y = rnd.getFloat()*1e6f - 1e5f;
			const float z = rnd.getFloat()*1e6f - 1e5f;
			const float w = rnd.getFloat()*1e6f - 1e5f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packUnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}